

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreateInlineListFileSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  PositionType position;
  iterator it;
  ReferenceType pSVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  PositionType PStack_160;
  iterator local_150;
  SnapshotDataType local_130;
  cmLinkedTree<cmState::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_38 [8];
  PositionType pos;
  string *fileName_local;
  long entryPointLine_local;
  string *entryPointCommand_local;
  cmState *this_local;
  
  local_48 = originSnapshot.Position.Tree;
  PStack_40 = originSnapshot.Position.Position;
  pos.Position = (PositionType)fileName;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType(&local_130,pSVar1);
  iVar5.Position = PStack_40;
  iVar5.Tree = local_48;
  iVar5 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,iVar5,&local_130);
  pos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)iVar5.Position;
  local_38 = (undefined1  [8])iVar5.Tree;
  SnapshotDataType::~SnapshotDataType(&local_130);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar2->EntryPointLine = entryPointLine;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  std::__cxx11::string::operator=((string *)&pSVar2->EntryPointCommand,(string *)entryPointCommand);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar2->SnapshotType = InlineListFileType;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar2->Keep = true;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  local_168 = (pSVar2->ExecutionListFile).Tree;
  PStack_160 = (pSVar2->ExecutionListFile).Position;
  std::__cxx11::string::string((string *)&local_188,(string *)pos.Position);
  it.Position = PStack_160;
  it.Tree = local_168;
  local_150 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Push(&this->ExecutionListFiles,it,&local_188);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar2->ExecutionListFile = local_150;
  std::__cxx11::string::~string((string *)&local_188);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  (pBVar3->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_38;
  (pBVar3->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  (pSVar4->PolicyScope).Tree = (pSVar2->Policies).Tree;
  (pSVar4->PolicyScope).Position = (pSVar2->Policies).Position;
  position.Position = (PositionType)pos.Tree;
  position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_38;
  Snapshot::Snapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateInlineListFileSnapshot(cmState::Snapshot originSnapshot,
                                      const std::string& entryPointCommand,
                                      long entryPointLine,
                                      const std::string& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = InlineListFileType;
  pos->Keep = true;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}